

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemShallowCopy(Mem *pTo,Mem *pFrom,int srcType)

{
  u8 uVar1;
  u8 uVar2;
  int iVar3;
  int srcType_local;
  Mem *pFrom_local;
  Mem *pTo_local;
  
  if ((pTo->flags & 0x2460) == 0) {
    pTo->u = pFrom->u;
    uVar1 = pFrom->enc;
    uVar2 = pFrom->eSubtype;
    iVar3 = pFrom->n;
    pTo->flags = pFrom->flags;
    pTo->enc = uVar1;
    pTo->eSubtype = uVar2;
    pTo->n = iVar3;
    pTo->z = pFrom->z;
    if ((pFrom->flags & 0x800) == 0) {
      pTo->flags = pTo->flags & 0xe3ff;
      pTo->flags = pTo->flags | (ushort)srcType;
    }
  }
  else {
    vdbeClrCopy(pTo,pFrom,srcType);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemShallowCopy(Mem *pTo, const Mem *pFrom, int srcType){
  assert( (pFrom->flags & MEM_RowSet)==0 );
  assert( pTo->db==pFrom->db );
  if( VdbeMemDynamic(pTo) ){ vdbeClrCopy(pTo,pFrom,srcType); return; }
  memcpy(pTo, pFrom, MEMCELLSIZE);
  if( (pFrom->flags&MEM_Static)==0 ){
    pTo->flags &= ~(MEM_Dyn|MEM_Static|MEM_Ephem);
    assert( srcType==MEM_Ephem || srcType==MEM_Static );
    pTo->flags |= srcType;
  }
}